

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O0

PSNode * __thiscall
dg::pta::PointerGraph::
create<(dg::pta::PSNodeType)20,dg::pta::PSNodeAlloc*&,dg::pta::PSNodeAlloc*&,unsigned_long_const&>
          (PointerGraph *this,PSNodeAlloc **args,PSNodeAlloc **args_1,unsigned_long *args_2)

{
  type __args;
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  *in_RCX;
  unsigned_long *in_RDI;
  PSNodeAlloc **unaff_retaddr;
  PSNodeAlloc **in_stack_00000008;
  PSNode *n;
  
  __args = nodeFactory<(dg::pta::PSNodeType)20,dg::pta::PSNodeAlloc*&,dg::pta::PSNodeAlloc*&,unsigned_long_const&,dg::pta::PSNodeMemcpy>
                     ((PointerGraph *)n,in_stack_00000008,unaff_retaddr,in_RDI);
  std::
  vector<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>,std::allocator<std::unique_ptr<dg::pta::PSNode,std::default_delete<dg::pta::PSNode>>>>
  ::emplace_back<dg::pta::PSNode*&>(in_RCX,(PSNode **)__args);
  return &__args->super_PSNode;
}

Assistant:

PSNode *create(Args &&...args) {
        PSNode *n = nodeFactory<Type>(std::forward<Args>(args)...);
        nodes.emplace_back(n); // C++17 returns a referece
        assert(n->getID() == nodes.size() - 1);
        return n;
    }